

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  zip_t *pzVar3;
  ssize_t sVar4;
  unsigned_long_long uVar5;
  FILE *__s;
  char *pcVar6;
  double dVar7;
  double dVar8;
  undefined8 uStackY_40;
  char *in_stack_ffffffffffffffc8;
  undefined4 uVar9;
  
  minunit_setup = test_setup;
  minunit_teardown = test_teardown;
  if ((((minunit_real_timer != 0.0) || (NAN(minunit_real_timer))) || (minunit_proc_timer != 0.0)) ||
     (NAN(minunit_proc_timer))) {
LAB_001024aa:
    test_setup();
  }
  else {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
    if (minunit_setup != (_func_void *)0x0) goto LAB_001024aa;
  }
  minunit_status = '\0';
  pzVar3 = zip_open(ZIPNAME,6,'w');
  minunit_assert = minunit_assert + 1;
  if (pzVar3 == (zip_t *)0x0) {
    in_stack_ffffffffffffffc8 = "zip != NULL";
    pcVar6 = "%s failed:\n\t%s:%d: %s";
    uStackY_40 = 0x27;
LAB_0010270a:
    snprintf(minunit_last_message,0x400,pcVar6,"test_write",
             "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
             uStackY_40,in_stack_ffffffffffffffc8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00102725:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_entry_open(pzVar3,"test/test-1.txt");
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x29;
      goto LAB_0010270a;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_entry_write(pzVar3,"Some test data 1...",0x13);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x2a;
      goto LAB_0010270a;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    pcVar6 = zip_entry_name(pzVar3);
    iVar1 = strcmp(pcVar6,"test/test-1.txt");
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x2b;
      goto LAB_0010270a;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    sVar4 = zip_entry_index(pzVar3);
    if ((int)sVar4 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x2c;
      goto LAB_0010270a;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar5 = zip_entry_size(pzVar3);
    if ((int)uVar5 != 0x13) {
      in_stack_ffffffffffffffc8 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),0x13);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x2d;
      goto LAB_0010270a;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar2 = zip_entry_crc32(pzVar3);
    if (uVar2 != 0x845ecdfa) {
      in_stack_ffffffffffffffc8 = "CRC32DATA1 == zip_entry_crc32(zip)";
      pcVar6 = "%s failed:\n\t%s:%d: %s";
      uStackY_40 = 0x2e;
      goto LAB_0010270a;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_entry_close(pzVar3);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x2f;
      goto LAB_0010270a;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_is64(pzVar3);
    if (iVar1 != 1) {
      in_stack_ffffffffffffffc8 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),1);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x31;
      goto LAB_0010270a;
    }
    putchar(0x2e);
    zip_close(pzVar3);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00102725;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    test_teardown();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    test_setup();
  }
  minunit_status = '\0';
  pzVar3 = zip_open(ZIPNAME,6,'w');
  minunit_assert = minunit_assert + 1;
  if (pzVar3 == (zip_t *)0x0) {
    in_stack_ffffffffffffffc8 = "zip != NULL";
    pcVar6 = "%s failed:\n\t%s:%d: %s";
    uStackY_40 = 0x38;
LAB_00102a07:
    snprintf(minunit_last_message,0x400,pcVar6,"test_write_utf",
             "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
             uStackY_40,in_stack_ffffffffffffffc8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
LAB_00102a22:
    minunit_fail = minunit_fail + 1;
    putchar(0x46);
    printf("\n%s\n",minunit_last_message);
  }
  else {
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_entry_open(pzVar3,anon_var_dwarf_1b8);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x3a;
      goto LAB_00102a07;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_entry_write(pzVar3,"Some test data 1...",0x13);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x3b;
      goto LAB_00102a07;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    pcVar6 = zip_entry_name(pzVar3);
    iVar1 = strcmp(pcVar6,anon_var_dwarf_1b8);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x3d;
      goto LAB_00102a07;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    sVar4 = zip_entry_index(pzVar3);
    if ((int)sVar4 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x3e;
      goto LAB_00102a07;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar5 = zip_entry_size(pzVar3);
    if ((int)uVar5 != 0x13) {
      in_stack_ffffffffffffffc8 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),0x13);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x3f;
      goto LAB_00102a07;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    uVar2 = zip_entry_crc32(pzVar3);
    if (uVar2 != 0x845ecdfa) {
      in_stack_ffffffffffffffc8 = "CRC32DATA1 == zip_entry_crc32(zip)";
      pcVar6 = "%s failed:\n\t%s:%d: %s";
      uStackY_40 = 0x40;
      goto LAB_00102a07;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_entry_close(pzVar3);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x41;
      goto LAB_00102a07;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_is64(pzVar3);
    if (iVar1 != 1) {
      in_stack_ffffffffffffffc8 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),1);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x43;
      goto LAB_00102a07;
    }
    putchar(0x2e);
    zip_close(pzVar3);
    minunit_run = minunit_run + 1;
    if (minunit_status == '\x01') goto LAB_00102a22;
  }
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    test_teardown();
  }
  if (((minunit_real_timer == 0.0) && (!NAN(minunit_real_timer))) &&
     ((minunit_proc_timer == 0.0 && (!NAN(minunit_proc_timer))))) {
    minunit_real_timer = mu_timer_real();
    minunit_proc_timer = mu_timer_cpu();
  }
  if (minunit_setup != (_func_void *)0x0) {
    test_setup();
  }
  minunit_status = '\0';
  __s = fopen(WFILE,"w+");
  if (__s == (FILE *)0x0) {
    minunit_assert = minunit_assert + 1;
    in_stack_ffffffffffffffc8 = "Cannot open filename\n";
    pcVar6 = "%s failed:\n\t%s:%d: %s";
    uStackY_40 = 0x53;
LAB_00102b4d:
    snprintf(minunit_last_message,0x400,pcVar6,"test_fwrite",
             "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/test/test_write.c",
             uStackY_40,in_stack_ffffffffffffffc8);
    minunit_status = '\x01';
    minunit_run = minunit_run + 1;
  }
  else {
    fwrite("Some test data 1...",1,0x13,__s);
    minunit_assert = minunit_assert + 1;
    iVar1 = fclose(__s);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x56;
      goto LAB_00102b4d;
    }
    putchar(0x2e);
    pzVar3 = zip_open(ZIPNAME,9,'w');
    minunit_assert = minunit_assert + 1;
    if (pzVar3 == (zip_t *)0x0) {
      in_stack_ffffffffffffffc8 = "zip != NULL";
      pcVar6 = "%s failed:\n\t%s:%d: %s";
      uStackY_40 = 0x59;
      goto LAB_00102b4d;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_entry_open(pzVar3,WFILE);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x5a;
      goto LAB_00102b4d;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_entry_fwrite(pzVar3,WFILE);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x5b;
      goto LAB_00102b4d;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_entry_close(pzVar3);
    uVar9 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffc8 = (char *)((ulong)in_stack_ffffffffffffffc8 & 0xffffffff00000000);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x5c;
      goto LAB_00102b4d;
    }
    putchar(0x2e);
    minunit_assert = minunit_assert + 1;
    iVar1 = zip_is64(pzVar3);
    if (iVar1 != 1) {
      in_stack_ffffffffffffffc8 = (char *)CONCAT44(uVar9,1);
      pcVar6 = "%s failed:\n\t%s:%d: %d expected but was %d";
      uStackY_40 = 0x5d;
      goto LAB_00102b4d;
    }
    putchar(0x2e);
    zip_close(pzVar3);
    minunit_run = minunit_run + 1;
    if (minunit_status != '\x01') goto LAB_00102b8b;
  }
  minunit_fail = minunit_fail + 1;
  putchar(0x46);
  printf("\n%s\n",minunit_last_message);
LAB_00102b8b:
  fflush(_stdout);
  if (minunit_teardown != (_func_void *)0x0) {
    test_teardown();
  }
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  printf("\n\n%d tests, %d assertions, %d failures\n",(ulong)(uint)minunit_run,
         (ulong)(uint)minunit_assert,(ulong)(uint)minunit_fail);
  dVar7 = mu_timer_real();
  dVar8 = mu_timer_cpu();
  printf("\nFinished in %.8f seconds (real) %.8f seconds (proc)\n\n",dVar7 - minunit_real_timer,
         dVar8 - minunit_proc_timer);
  return minunit_fail;
}

Assistant:

MU_TEST_SUITE(test_write_suite) {
  MU_SUITE_CONFIGURE(&test_setup, &test_teardown);

  MU_RUN_TEST(test_write);
  MU_RUN_TEST(test_write_utf);
  MU_RUN_TEST(test_fwrite);
}